

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

void Js::JavascriptExceptionOperators::ThrowExceptionObjectInternal
               (JavascriptExceptionObject *exceptionObject,ScriptContext *scriptContext,
               bool fillExceptionContext,bool considerPassingToDebugger,PVOID returnAddress,
               bool resetStack)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  undefined4 *puVar4;
  Var thrownObject;
  uint64 stackCrawlLimit;
  undefined1 local_68 [8];
  JavascriptExceptionContext exceptionContext;
  
  if (scriptContext == (ScriptContext *)0x0) {
    if ((exceptionObject->field_0x14 & 2) == 0) goto LAB_00a963c2;
    pTVar3 = ThreadContext::GetContextForCurrentThread();
  }
  else {
    pTVar3 = scriptContext->threadContext;
    pTVar3->noJsReentrancy = false;
    if (fillExceptionContext) {
      exceptionContext.m_originalStackTrace.ptr =
           (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)returnAddress;
      if (exceptionObject == (JavascriptExceptionObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x528,"(exceptionObject)","exceptionObject");
        if (!bVar2) goto LAB_00a96438;
        *puVar4 = 0;
      }
      local_68 = (undefined1  [8])0x0;
      exceptionContext.m_throwingFunction.ptr._0_4_ = 0;
      exceptionContext.m_throwingFunctionByteCodeOffset = 0;
      exceptionContext._12_4_ = 0;
      exceptionContext.m_stackTrace.ptr =
           (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      thrownObject = JavascriptExceptionObject::GetThrownObject
                               (exceptionObject,(ScriptContext *)0x0);
      if ((DAT_015bc474 != '\x01') ||
         (stackCrawlLimit = 0xffffffffffffffff,
         scriptContext->threadContext->hasCatchHandler == true)) {
        stackCrawlLimit = GetStackTraceLimit(thrownObject,scriptContext);
      }
      WalkStackForExceptionContext
                (scriptContext,(JavascriptExceptionContext *)local_68,thrownObject,stackCrawlLimit,
                 exceptionContext.m_originalStackTrace.ptr,true,resetStack);
      JavascriptExceptionObject::FillError
                (exceptionObject,(JavascriptExceptionContext *)local_68,scriptContext,
                 (HostWrapperCreateFuncType)0x0);
      AddStackTraceToObject
                (thrownObject,(StackTrace *)exceptionContext._8_8_,scriptContext,true,resetStack);
    }
    if ((((pTVar3->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) &&
        ((pTVar3->disableImplicitFlags & DisableImplicitExceptionFlag) != DisableImplicitNoFlag)) &&
       (ImplicitCall_None < pTVar3->implicitCallFlags)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                         ,0x538,
                         "(!( threadContext->IsDisableImplicitCall() && threadContext->GetImplicitCallFlags() & (~ImplicitCall_None) ) || !threadContext->IsDisableImplicitException())"
                         ,
                         "!( threadContext->IsDisableImplicitCall() && threadContext->GetImplicitCallFlags() & (~ImplicitCall_None) ) || !threadContext->IsDisableImplicitException()"
                        );
      if (!bVar2) {
LAB_00a96438:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pTVar3->disableImplicitFlags = DisableImplicitNoFlag;
    if (fillExceptionContext && considerPassingToDebugger) {
      DispatchExceptionToDebugger(exceptionObject,scriptContext);
    }
    if ((exceptionObject->field_0x14 & 2) == 0) goto LAB_00a963c2;
    pTVar3 = scriptContext->threadContext;
  }
  ThreadContext::SetHasThrownPendingException(pTVar3);
LAB_00a963c2:
  DoThrow(exceptionObject,scriptContext);
}

Assistant:

void JavascriptExceptionOperators::ThrowExceptionObjectInternal(Js::JavascriptExceptionObject * exceptionObject, ScriptContext* scriptContext, bool fillExceptionContext, bool considerPassingToDebugger, PVOID returnAddress, bool resetStack)
    {
        if (scriptContext)
        {
            ThreadContext *threadContext = scriptContext->GetThreadContext();
#if ENABLE_JS_REENTRANCY_CHECK
            threadContext->SetNoJsReentrancy(false);
#endif
            if (fillExceptionContext)
            {
                Assert(exceptionObject);

                JavascriptExceptionContext exceptionContext;
                Var thrownObject = exceptionObject->GetThrownObject(nullptr);
                WalkStackForExceptionContext(*scriptContext, exceptionContext, thrownObject, StackCrawlLimitOnThrow(thrownObject, *scriptContext), returnAddress, /*isThrownException=*/ true, resetStack);
                exceptionObject->FillError(exceptionContext, scriptContext);
                AddStackTraceToObject(thrownObject, exceptionContext.GetStackTrace(), *scriptContext, /*isThrownException=*/ true, resetStack);
            }
            Assert(// If we disabled implicit calls and we did record an implicit call, do not throw.
                   // Check your helper to see if a call recorded an implicit call that might cause an invalid value
                   !(
                       threadContext->IsDisableImplicitCall() &&
                       threadContext->GetImplicitCallFlags() & (~ImplicitCall_None)
                    ) ||
                   // Make sure we didn't disable exceptions
                   !threadContext->IsDisableImplicitException()
            );

            threadContext->ClearDisableImplicitFlags();

            if (fillExceptionContext && considerPassingToDebugger)
            {
                DispatchExceptionToDebugger(exceptionObject, scriptContext);
            }
        }

        if (exceptionObject->IsPendingExceptionObject())
        {
            ThreadContext * threadContext = scriptContext? scriptContext->GetThreadContext() : ThreadContext::GetContextForCurrentThread();
            threadContext->SetHasThrownPendingException();
        }

        DoThrow(exceptionObject, scriptContext);
    }